

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O3

StatementSyntax * __thiscall
slang::parsing::Parser::parseWaitStatement(Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  bool bVar1;
  WaitStatementSyntax *pWVar2;
  ExpressionSyntax *expr;
  StatementSyntax *statement;
  __extent_storage<18446744073709551615UL> _Var3;
  Token wait;
  Token TVar4;
  Token TVar5;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  _Var3 = attributes._M_extent._M_extent_value;
  wait = ParserBase::consume(&this->super_ParserBase);
  bVar1 = ParserBase::peek(&this->super_ParserBase,ForkKeyword);
  local_68.super_SyntaxListBase.childCount = _Var3._M_extent_value;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       attributes._M_ptr;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = _Var3._M_extent_value;
  if (bVar1) {
    TVar4 = ParserBase::consume(&this->super_ParserBase);
    local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00698d40;
    TVar5 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pWVar2 = (WaitStatementSyntax *)
             slang::syntax::SyntaxFactory::waitForkStatement
                       (&this->factory,label,&local_68,wait,TVar4,TVar5);
  }
  else {
    TVar4 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
    expr = parseExpression(this);
    TVar5 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
    local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00698d40;
    statement = parseStatement(this,true,false);
    pWVar2 = slang::syntax::SyntaxFactory::waitStatement
                       (&this->factory,label,&local_68,wait,TVar4,expr,TVar5,statement);
  }
  return &pWVar2->super_StatementSyntax;
}

Assistant:

StatementSyntax& Parser::parseWaitStatement(NamedLabelSyntax* label, AttrList attributes) {
    auto wait = consume();
    if (peek(TokenKind::ForkKeyword)) {
        auto fork = consume();
        return factory.waitForkStatement(label, attributes, wait, fork,
                                         expect(TokenKind::Semicolon));
    }

    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& expr = parseExpression();
    auto closeParen = expect(TokenKind::CloseParenthesis);
    return factory.waitStatement(label, attributes, wait, openParen, expr, closeParen,
                                 parseStatement());
}